

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.cpp
# Opt level: O2

void ast::Symbols::print(ostream *os)

{
  Symbol *pSVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>
  pair_symbol;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>
  local_58;
  
  plVar3 = (long *)(table_abi_cxx11_ + 0x10);
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>
    ::pair(&local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>
            *)(plVar3 + 1));
    pSVar1 = local_58.second;
    iVar4 = 0;
    if ((local_58.second)->type < UNDEFINED) {
      iVar4 = (local_58.second)->value_expression->value;
    }
    uVar2 = Sections::get_address((local_58.second)->section);
    uVar2 = uVar2 + iVar4 & 0xffff;
    ostream_printf(os,"%-30s %-10s %5d %04x %d\n",(pSVar1->name)._M_dataplus._M_p,
                   *(undefined8 *)(value_type_name + (ulong)pSVar1->type * 8),(ulong)uVar2,
                   (ulong)uVar2,pSVar1->section);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void Symbols::print(std::ostream &os)
{
	for (auto pair_symbol: table) {
		Symbol *symbol = pair_symbol.second;
		uint16_t value = symbol->get_value() + Sections::get_address(symbol->section);
		ostream_printf(os, "%-30s %-10s %5d %04x %d\n",
				symbol->name.c_str(), value_type_name[symbol->type],
				value, value, symbol->section);
	}
}